

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O3

int __thiscall
ncnn::Proposal::forward
          (Proposal *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  pointer pMVar1;
  pointer pfVar2;
  float fVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  size_t sVar16;
  pointer pMVar17;
  int *piVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [12];
  bool bVar22;
  int iVar23;
  void *pvVar24;
  undefined8 *puVar25;
  long lVar26;
  ulong uVar27;
  float *pfVar28;
  uint uVar29;
  uint uVar30;
  long lVar31;
  long lVar32;
  Rect *pRVar33;
  ulong uVar34;
  ulong uVar35;
  void *pvVar36;
  size_t sVar37;
  void *pvVar38;
  void *pvVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  uint uVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float in_XMM5_Db;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  vector<int,_std::allocator<int>_> picked;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> proposal_boxes;
  vector<float,_std::allocator<float>_> scores;
  vector<float,_std::allocator<float>_> areas;
  int local_24c;
  undefined1 local_248 [8];
  undefined8 uStack_240;
  int *local_238;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> local_228;
  undefined1 local_208 [16];
  vector<float,_std::allocator<float>_> local_1f8;
  pointer local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  long local_1b8;
  ulong local_1b0;
  float local_1a4;
  float local_1a0;
  float local_19c;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_198;
  void *local_190;
  void *local_188;
  void *local_180;
  void *local_178;
  long local_170;
  void *local_168;
  ulong local_160;
  ulong local_158;
  vector<float,_std::allocator<float>_> local_150;
  undefined8 local_138;
  undefined8 local_130;
  int local_128;
  undefined4 local_124;
  ulong local_120;
  long local_118;
  long local_110;
  ulong local_108;
  long local_100;
  long local_f8;
  long local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  int *piStack_d0;
  undefined8 local_c8;
  long *local_c0;
  undefined8 local_b8;
  uint local_b0;
  int local_ac;
  ulong local_a8;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  undefined1 local_48 [24];
  
  local_1e0 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
  local_160 = (ulong)local_1e0->w;
  local_158 = (ulong)(uint)local_1e0->h;
  iVar23 = (this->anchors).h;
  lVar32 = (long)iVar23;
  local_b0 = local_1e0->h * local_1e0->w;
  local_1c8 = (ulong)local_b0;
  local_d8 = 0;
  piStack_d0 = (int *)0x0;
  local_c8 = 4;
  local_c0 = (long *)0x0;
  local_b8 = 0x400000003;
  local_108 = (ulong)(int)(local_b0 * 4);
  local_1d0 = local_108 & 0x3ffffffffffffffc;
  lVar31 = local_1d0 * lVar32;
  local_198 = top_blobs;
  local_ac = iVar23;
  local_a8 = local_1d0;
  if (lVar31 != 0) {
    pvVar24 = malloc(lVar31 * 4 + 0x1c);
    local_d8 = (long)pvVar24 + 0x17U & 0xfffffffffffffff0;
    *(void **)(local_d8 - 8) = pvVar24;
    piStack_d0 = (int *)(local_d8 + lVar31 * 4);
    *piStack_d0 = 1;
  }
  local_1b0 = local_1c8 & 0xffffffff;
  local_1d8 = local_d8;
  local_170 = lVar32;
  if (iVar23 < 1) {
    puVar25 = (undefined8 *)local_1e0[2].data;
  }
  else {
    uVar34 = local_160 & 0xffffffff;
    lVar31 = local_1e0[1].cstep * local_1e0[1].elemsize;
    local_180 = local_1e0[1].data;
    local_1d0 = local_1d0 << 2;
    local_168 = (this->anchors).data;
    local_118 = (long)(this->anchors).w;
    local_1a4 = (float)this->feat_stride;
    local_f0 = local_160 << 4;
    local_188 = (void *)(lVar31 * 3 + (long)local_180);
    local_110 = lVar31 * 4;
    local_f8 = local_160 * 4;
    local_190 = (void *)((long)local_180 + lVar31 * 2);
    local_178 = (void *)(lVar31 + (long)local_180);
    local_1b8 = 0;
    local_1c0 = local_d8;
    do {
      if (0 < (int)local_158) {
        local_100 = local_1b8 * local_118;
        uVar5 = *(undefined8 *)((long)local_168 + local_100 * 4);
        uVar6 = *(undefined8 *)((long)local_168 + local_100 * 4 + 8);
        fVar45 = (float)uVar6 - (float)uVar5;
        fVar49 = (float)((ulong)uVar5 >> 0x20);
        fVar46 = (float)((ulong)uVar6 >> 0x20) - fVar49;
        fStack_80 = fVar45 * 0.5;
        fStack_7c = fVar46 * 0.5;
        local_1a0 = (float)this->feat_stride;
        uVar27 = 0;
        local_78 = CONCAT44(fVar46,fVar45);
        uStack_70 = 0;
        pvVar24 = local_188;
        uVar35 = local_1c0;
        pvVar36 = local_178;
        pvVar38 = local_180;
        pvVar39 = local_190;
        fVar51 = fVar49;
        fVar47 = fVar49;
        fVar44 = fVar49;
        local_98 = fVar46;
        fStack_94 = fVar46;
        fStack_90 = fVar46;
        fStack_8c = fVar46;
        fStack_84 = in_XMM5_Db;
        do {
          local_e8 = uVar27;
          if (0 < (int)local_160) {
            fVar48 = *(float *)((long)local_168 + local_100 * 4);
            local_208._4_4_ = 0;
            local_208._8_4_ = 0;
            local_208._12_4_ = 0;
            lVar31 = 0;
            local_e0 = uVar35;
            local_68 = fVar49;
            fStack_64 = fVar51;
            fStack_60 = fVar47;
            fStack_5c = fVar44;
            do {
              local_208._0_4_ = fVar48;
              local_19c = *(float *)((long)pvVar24 + lVar31);
              local_48._0_4_ = (*(float *)((long)pvVar36 + lVar31) + 0.5) * fVar46;
              local_48._4_4_ = 0;
              local_48._8_4_ = (*(float *)((long)pvVar38 + lVar31) + 0.5) * fVar45;
              local_48._12_4_ = 0;
              local_58 = expf(*(float *)((long)pvVar39 + lVar31));
              fVar45 = expf(local_19c);
              fVar49 = (float)local_48._8_4_ + (float)local_208._0_4_;
              fVar51 = (float)local_48._0_4_ + local_68;
              fVar46 = local_58 * fStack_80;
              fVar45 = fVar45 * fStack_7c;
              auVar42._4_4_ = fVar45;
              auVar42._0_4_ = fVar46;
              auVar42._8_4_ = fVar49;
              auVar42._12_4_ = fVar51;
              auVar21._4_8_ = auVar42._8_8_;
              auVar21._0_4_ = fVar45 + local_68 * fStack_84;
              auVar40._0_8_ = auVar21._0_8_ << 0x20;
              auVar40._8_4_ = fVar49 + fVar46;
              auVar40._12_4_ = fVar51 + fVar45;
              puVar25 = (undefined8 *)(local_e0 + lVar31 * 4);
              *puVar25 = CONCAT44(fVar51 - fVar45,fVar49 - fVar46);
              puVar25[1] = auVar40._8_8_;
              fVar48 = (float)local_208._0_4_ + local_1a0;
              lVar31 = lVar31 + 4;
              uVar35 = local_e0;
              fVar45 = (float)local_78;
              in_XMM5_Db = fStack_84;
              fVar46 = local_98;
              fVar49 = local_68;
              fVar51 = fStack_64;
              fVar47 = fStack_60;
              fVar44 = fStack_5c;
            } while (uVar34 << 2 != lVar31);
          }
          fVar49 = fVar49 + local_1a4;
          uVar27 = local_e8 + 1;
          uVar35 = uVar35 + local_f0;
          pvVar24 = (void *)((long)pvVar24 + local_f8);
          pvVar39 = (void *)((long)pvVar39 + local_f8);
          pvVar36 = (void *)((long)pvVar36 + local_f8);
          pvVar38 = (void *)((long)pvVar38 + local_f8);
        } while (uVar27 != local_158);
      }
      local_1b8 = local_1b8 + 1;
      local_1c0 = local_1c0 + local_1d0;
      local_188 = (void *)((long)local_188 + local_110);
      local_190 = (void *)((long)local_190 + local_110);
      local_178 = (void *)((long)local_178 + local_110);
      local_180 = (void *)((long)local_180 + local_110);
    } while (local_1b8 != local_170);
    puVar25 = (undefined8 *)local_1e0[2].data;
    if (0 < (int)local_170) {
      fVar45 = (float)*puVar25;
      fVar46 = (float)((ulong)*puVar25 >> 0x20);
      auVar41._0_4_ = fVar46 + -1.0;
      auVar41._4_4_ = fVar45 + -1.0;
      auVar41._8_4_ = fVar46 + -1.0;
      auVar41._12_4_ = fVar45 + -1.0;
      lVar31 = 0;
      uVar34 = local_1d8;
      do {
        if (0 < (int)local_1c8) {
          lVar32 = 0;
          do {
            auVar42 = minps(*(undefined1 (*) [16])(uVar34 + lVar32),auVar41);
            auVar42 = maxps(auVar42,ZEXT816(0));
            *(undefined1 (*) [16])(uVar34 + lVar32) = auVar42;
            lVar32 = lVar32 + 0x10;
          } while (local_1b0 << 4 != lVar32);
        }
        lVar31 = lVar31 + 1;
        uVar34 = uVar34 + local_1d0;
      } while (lVar31 != local_170);
    }
  }
  local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_start = (Rect *)0x0;
  local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_finish = (Rect *)0x0;
  local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Rect *)0x0;
  local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  if (0 < (int)local_170) {
    local_208._0_4_ = (float)this->min_size * *(float *)(puVar25 + 1);
    local_1b0 = local_1b0 << 2;
    lVar32 = 0;
    lVar31 = local_170;
    do {
      pfVar2 = (pointer)(local_1d8 + lVar32 * local_108 * 4);
      local_150.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_150.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x4;
      local_138 = 0;
      local_130 = 0x400000002;
      local_128 = (int)local_1c8;
      local_124 = 1;
      local_120 = local_108;
      local_150.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = pfVar2;
      if (0 < local_128) {
        sVar37 = local_1e0->elemsize;
        sVar16 = local_1e0->cstep;
        pvVar24 = local_1e0->data;
        uVar34 = 0;
        do {
          lVar26 = (long)(int)uVar34;
          fVar45 = pfVar2[lVar26];
          if (((float)local_208._0_4_ <= (pfVar2[lVar26 + 2] + 1.0) - fVar45) &&
             ((float)local_208._0_4_ <= (pfVar2[lVar26 + 3] + 1.0) - pfVar2[lVar26 + 1])) {
            local_248._4_4_ = pfVar2[lVar26 + 1];
            local_248._0_4_ = fVar45;
            uStack_240._0_4_ = pfVar2[lVar26 + 2];
            uStack_240._4_4_ = pfVar2[lVar26 + 3];
            if (local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<ncnn::Rect,std::allocator<ncnn::Rect>>::
              _M_realloc_insert<ncnn::Rect_const&>
                        ((vector<ncnn::Rect,std::allocator<ncnn::Rect>> *)&local_228,
                         (iterator)
                         local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(Rect *)local_248);
            }
            else {
              (local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->x1 = fVar45;
              (local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->y1 = (float)local_248._4_4_;
              (local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->x2 = (float)uStack_240;
              (local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->y2 = uStack_240._4_4_;
              local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            pfVar28 = (float *)((long)pvVar24 + uVar34 + sVar37 * sVar16 * lVar31);
            if (local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)&local_1f8,
                         (iterator)
                         local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish,pfVar28);
            }
            else {
              *local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish = *pfVar28;
              local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          uVar34 = uVar34 + 4;
        } while (local_1b0 != uVar34);
      }
      lVar32 = lVar32 + 1;
      lVar31 = lVar31 + 1;
    } while (lVar32 != local_170);
    if ((local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
         super__Vector_impl_data._M_start !=
         local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
         super__Vector_impl_data._M_finish) &&
       (local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish)) {
      qsort_descent_inplace<ncnn::Rect>
                (&local_228,&local_1f8,0,
                 (int)((ulong)((long)local_1f8.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_1f8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2) + -1);
    }
  }
  iVar23 = this->pre_nms_topN;
  if ((0 < (long)iVar23) &&
     (iVar23 < (int)((ulong)((long)local_228.
                                   super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_228.
                                  super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 4))) {
    std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::resize(&local_228,(long)iVar23);
    std::vector<float,_std::allocator<float>_>::resize(&local_1f8,(long)this->pre_nms_topN);
  }
  local_248 = (undefined1  [8])0x0;
  uStack_240 = (int *)0x0;
  local_238 = (int *)0x0;
  local_208._0_4_ = this->nms_thresh;
  uVar30 = (uint)((ulong)((long)local_228.
                                super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4);
  std::vector<float,_std::allocator<float>_>::vector
            (&local_150,(long)(int)uVar30,(allocator_type *)&local_24c);
  if (0 < (int)uVar30) {
    pfVar28 = &(local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                super__Vector_impl_data._M_start)->x2;
    uVar34 = 0;
    do {
      uVar4 = ((Rect *)(pfVar28 + -2))->x1;
      uVar7 = ((Rect *)(pfVar28 + -2))->y1;
      local_150.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar34] =
           ((float)((ulong)*(undefined8 *)pfVar28 >> 0x20) - (float)uVar7) *
           ((float)*(undefined8 *)pfVar28 - (float)uVar4);
      uVar34 = uVar34 + 1;
      pfVar28 = pfVar28 + 4;
    } while ((uVar30 & 0x7fffffff) != uVar34);
    local_24c = 0;
    do {
      uVar29 = (uint)((ulong)((long)uStack_240 - (long)local_248) >> 2);
      if ((int)uVar29 < 1) {
LAB_00114f5b:
        if (uStack_240 == local_238) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)local_248,uStack_240,&local_24c);
        }
        else {
          *uStack_240 = local_24c;
          uStack_240 = uStack_240 + 1;
        }
      }
      else {
        lVar31 = (long)local_24c;
        fVar45 = local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar31].x1;
        bVar22 = true;
        uVar34 = 0;
        do {
          iVar23 = *(int *)((long)local_248 + uVar34 * 4);
          fVar46 = local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar23].x2;
          fVar49 = 0.0;
          if (fVar45 <= fVar46) {
            pRVar33 = local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start + iVar23;
            fVar51 = local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar31].x2;
            fVar47 = pRVar33->x1;
            if (fVar47 <= fVar51) {
              fVar44 = local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl
                       .super__Vector_impl_data._M_start[lVar31].y1;
              fVar48 = pRVar33->y2;
              if (fVar44 <= fVar48) {
                fVar3 = local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar31].y2;
                fVar50 = pRVar33->y1;
                if (fVar50 <= fVar3) {
                  if (fVar51 <= fVar46) {
                    fVar46 = fVar51;
                  }
                  if (fVar47 <= fVar45) {
                    fVar47 = fVar45;
                  }
                  if (fVar3 <= fVar48) {
                    fVar48 = fVar3;
                  }
                  if (fVar50 <= fVar44) {
                    fVar50 = fVar44;
                  }
                  fVar49 = (fVar48 - fVar50) * (fVar46 - fVar47);
                }
              }
            }
          }
          if ((float)local_208._0_4_ <
              fVar49 / ((local_150.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar31] - fVar49) +
                       local_150.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar23])) {
            bVar22 = false;
          }
          uVar34 = uVar34 + 1;
        } while ((uVar29 & 0x7fffffff) != uVar34);
        if (bVar22) goto LAB_00114f5b;
      }
      local_24c = local_24c + 1;
    } while (local_24c < (int)uVar30);
  }
  if (local_150.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_150.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_150.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  uVar30 = (uint)((ulong)((long)uStack_240 - (long)local_248) >> 2);
  if (this->after_nms_topN < (int)uVar30) {
    uVar30 = this->after_nms_topN;
  }
  pMVar17 = (local_198->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar8 = pMVar17->dims;
  uVar10 = pMVar17->w;
  uVar12 = pMVar17->h;
  uVar14 = pMVar17->c;
  auVar42 = ZEXT416(uVar30);
  auVar19._4_4_ = -(uint)(uVar10 == 4);
  auVar19._0_4_ = -(uint)(uVar8 == 3);
  auVar19._8_4_ = -(uint)(uVar12 == 1);
  auVar19._12_4_ = -(uint)(uVar30 == uVar14);
  iVar23 = movmskps((int)local_198,auVar19);
  if (((iVar23 == 0xf) && (pMVar17->allocator == (Allocator *)0x0)) && (pMVar17->elemsize == 4)) {
    pvVar24 = pMVar17->data;
    if (pvVar24 == (void *)0x0) {
LAB_001151dd:
      iVar23 = -100;
      goto LAB_001151e3;
    }
    sVar37 = pMVar17->cstep;
    uVar29 = uVar30;
    uVar43 = uVar30;
  }
  else {
    piVar18 = pMVar17->refcount;
    if (piVar18 != (int *)0x0) {
      LOCK();
      *piVar18 = *piVar18 + -1;
      UNLOCK();
      if (*piVar18 == 0) {
        if (pMVar17->allocator == (Allocator *)0x0) {
          if (pMVar17->data != (void *)0x0) {
            local_208 = auVar42;
            free(*(void **)((long)pMVar17->data + -8));
            auVar42 = local_208;
          }
        }
        else {
          local_208 = auVar42;
          (**(code **)(*(long *)pMVar17->allocator + 8))();
          auVar42 = local_208;
        }
      }
    }
    pMVar17->data = (void *)0x0;
    pMVar17->refcount = (int *)0x0;
    sVar37 = 4;
    pMVar17->elemsize = 4;
    pMVar17->allocator = (Allocator *)0x0;
    pMVar17->dims = 3;
    pMVar17->w = 4;
    pMVar17->h = 1;
    pMVar17->c = uVar30;
    pMVar17->cstep = 4;
    if (uVar30 == 0) goto LAB_001151dd;
    lVar31 = (long)(int)uVar30 * 0x10;
    local_208 = auVar42;
    pvVar36 = malloc(lVar31 + 0x1c);
    pvVar24 = (void *)((long)pvVar36 + 0x17U & 0xfffffffffffffff0);
    *(void **)((long)pvVar24 - 8) = pvVar36;
    pMVar17->data = pvVar24;
    pMVar17->refcount = (int *)((long)pvVar24 + lVar31);
    *(undefined4 *)((long)pvVar24 + lVar31) = 1;
    uVar29 = pMVar17->c;
    uVar43 = local_208._0_4_;
  }
  iVar23 = -100;
  if ((long)(int)uVar29 * sVar37 != 0) {
    if (0 < (int)uVar30) {
      pfVar28 = (float *)((long)pvVar24 + 0xc);
      uVar34 = 0;
      do {
        iVar23 = *(int *)((long)local_248 + uVar34 * 4);
        pfVar28[-3] = local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar23].x1;
        pfVar28[-2] = local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar23].y1;
        pfVar28[-1] = local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar23].x2;
        *pfVar28 = local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar23].y2;
        uVar34 = uVar34 + 1;
        pfVar28 = pfVar28 + sVar37;
      } while (uVar30 != uVar34);
    }
    pMVar17 = (local_198->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar31 = (long)(local_198->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar17 >> 3;
    iVar23 = 0;
    if (1 < (ulong)(lVar31 * 0x6db6db6db6db6db7)) {
      pMVar1 = pMVar17 + 1;
      uVar9 = pMVar17[1].dims;
      uVar11 = pMVar17[1].w;
      uVar13 = pMVar17[1].h;
      uVar15 = pMVar17[1].c;
      auVar20._4_4_ = -(uint)(uVar11 == 1);
      auVar20._0_4_ = -(uint)(uVar9 == 3);
      auVar20._8_4_ = -(uint)(uVar13 == 1);
      auVar20._12_4_ = -(uint)(uVar43 == uVar15);
      iVar23 = movmskps((int)lVar31,auVar20);
      if (((iVar23 == 0xf) && (pMVar17[1].allocator == (Allocator *)0x0)) &&
         (pMVar17[1].elemsize == 4)) {
        pfVar28 = (float *)pMVar1->data;
        iVar23 = -100;
        if (pfVar28 == (float *)0x0) goto LAB_001151e3;
        sVar37 = pMVar17[1].cstep;
        uVar29 = uVar30;
      }
      else {
        piVar18 = pMVar17[1].refcount;
        if (piVar18 != (int *)0x0) {
          LOCK();
          *piVar18 = *piVar18 + -1;
          UNLOCK();
          if (*piVar18 == 0) {
            if (pMVar17[1].allocator == (Allocator *)0x0) {
              if (pMVar17[1].data != (void *)0x0) {
                free(*(void **)((long)pMVar17[1].data + -8));
              }
            }
            else {
              (**(code **)(*(long *)pMVar17[1].allocator + 8))();
            }
          }
        }
        pMVar1->data = (void *)0x0;
        pMVar1->refcount = (int *)0x0;
        sVar37 = 4;
        pMVar17[1].elemsize = 4;
        pMVar17[1].allocator = (Allocator *)0x0;
        pMVar17[1].dims = 3;
        pMVar17[1].w = 1;
        pMVar17[1].h = 1;
        pMVar17[1].c = uVar30;
        pMVar17[1].cstep = 4;
        iVar23 = -100;
        if (uVar30 == 0) goto LAB_001151e3;
        lVar31 = (long)(int)uVar30;
        pvVar24 = malloc(lVar31 * 0x10 + 0x1c);
        pfVar28 = (float *)((long)pvVar24 + 0x17U & 0xfffffffffffffff0);
        *(void **)(pfVar28 + -2) = pvVar24;
        pMVar17[1].data = pfVar28;
        pMVar17[1].refcount = (int *)(pfVar28 + lVar31 * 4);
        pfVar28[lVar31 * 4] = 1.4013e-45;
        uVar29 = pMVar17[1].c;
      }
      iVar23 = -100;
      if (((long)(int)uVar29 * sVar37 != 0) && (iVar23 = 0, 0 < (int)uVar30)) {
        sVar16 = pMVar17[1].elemsize;
        iVar23 = 0;
        uVar34 = 0;
        do {
          *pfVar28 = local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[*(int *)((long)local_248 + uVar34 * 4)];
          uVar34 = uVar34 + 1;
          pfVar28 = (float *)((long)pfVar28 + sVar37 * sVar16);
        } while (uVar30 != uVar34);
      }
    }
  }
LAB_001151e3:
  if (local_248 != (undefined1  [8])0x0) {
    operator_delete((void *)local_248,(long)local_238 - (long)local_248);
  }
  if (local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
      super__Vector_impl_data._M_start != (Rect *)0x0) {
    operator_delete(local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (piStack_d0 != (int *)0x0) {
    LOCK();
    *piStack_d0 = *piStack_d0 + -1;
    UNLOCK();
    if (*piStack_d0 == 0) {
      if (local_c0 == (long *)0x0) {
        if (local_d8 != 0) {
          free(*(void **)(local_d8 - 8));
        }
      }
      else {
        (**(code **)(*local_c0 + 8))();
      }
    }
  }
  return iVar23;
}

Assistant:

int Proposal::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& score_blob = bottom_blobs[0];
    const Mat& bbox_blob = bottom_blobs[1];
    const Mat& im_info_blob = bottom_blobs[2];

    int w = score_blob.w;
    int h = score_blob.h;

    // generate proposals from bbox deltas and shifted anchors
    const int num_anchors = anchors.h;

    Mat proposals;
    proposals.create(4, w * h, num_anchors);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<num_anchors; q++)
    {
        const float* bbox_xptr = bbox_blob.channel(q * 4);
        const float* bbox_yptr = bbox_blob.channel(q * 4 + 1);
        const float* bbox_wptr = bbox_blob.channel(q * 4 + 2);
        const float* bbox_hptr = bbox_blob.channel(q * 4 + 3);

        Mat pbs = proposals.channel(q);

        const float* anchor = anchors.row(q);

        // shifted anchor
        float anchor_y = anchor[1];

        float anchor_w = anchor[2] - anchor[0];
        float anchor_h = anchor[3] - anchor[1];

        for (int i = 0; i < h; i++)
        {
            float anchor_x = anchor[0];

            for (int j = 0; j < w; j++)
            {
                float* pb = pbs.row(i*w + j);

                // apply center size
                float dx = bbox_xptr[j];
                float dy = bbox_yptr[j];
                float dw = bbox_wptr[j];
                float dh = bbox_hptr[j];

                float cx = anchor_x + anchor_w * 0.5f;
                float cy = anchor_y + anchor_h * 0.5f;

                float pb_cx = cx + anchor_w * dx;
                float pb_cy = cy + anchor_h * dy;

                float pb_w = anchor_w * exp(dw);
                float pb_h = anchor_h * exp(dh);

                pb[0] = pb_cx - pb_w * 0.5f;
                pb[1] = pb_cy - pb_h * 0.5f;
                pb[2] = pb_cx + pb_w * 0.5f;
                pb[3] = pb_cy + pb_h * 0.5f;

                anchor_x += feat_stride;
            }

            bbox_xptr += w;
            bbox_yptr += w;
            bbox_wptr += w;
            bbox_hptr += w;

            anchor_y += feat_stride;
        }
    }

    // clip predicted boxes to image
    float im_w = im_info_blob[1];
    float im_h = im_info_blob[0];

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            // clip box
            pb[0] = std::max(std::min(pb[0], im_w - 1), 0.f);
            pb[1] = std::max(std::min(pb[1], im_h - 1), 0.f);
            pb[2] = std::max(std::min(pb[2], im_w - 1), 0.f);
            pb[3] = std::max(std::min(pb[3], im_h - 1), 0.f);
        }
    }

    // remove predicted boxes with either height or width < threshold
    std::vector<Rect> proposal_boxes;
    std::vector<float> scores;

    float im_scale = im_info_blob[2];
    float min_boxsize = min_size * im_scale;

    for (int q=0; q<num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);
        const float* scoreptr = score_blob.channel(q + num_anchors);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            float pb_w = pb[2] - pb[0] + 1;
            float pb_h = pb[3] - pb[1] + 1;

            if (pb_w >= min_boxsize && pb_h >= min_boxsize)
            {
                Rect r = { pb[0], pb[1], pb[2], pb[3] };
                proposal_boxes.push_back(r);
                scores.push_back(scoreptr[i]);
            }
        }
    }

    // sort all (proposal, score) pairs by score from highest to lowest
    qsort_descent_inplace(proposal_boxes, scores);

    // take top pre_nms_topN
    if (pre_nms_topN > 0 && pre_nms_topN < (int)proposal_boxes.size())
    {
        proposal_boxes.resize(pre_nms_topN);
        scores.resize(pre_nms_topN);
    }

    // apply nms with nms_thresh
    std::vector<int> picked;
    nms_sorted_bboxes(proposal_boxes, picked, nms_thresh);

    // take after_nms_topN
    int picked_count = std::min((int)picked.size(), after_nms_topN);

    // return the top proposals
    Mat& roi_blob = top_blobs[0];
    roi_blob.create(4, 1, picked_count);
    if (roi_blob.empty())
        return -100;

    for (int i=0; i<picked_count; i++)
    {
        float* outptr = roi_blob.channel(i);

        outptr[0] = proposal_boxes[ picked[i] ].x1;
        outptr[1] = proposal_boxes[ picked[i] ].y1;
        outptr[2] = proposal_boxes[ picked[i] ].x2;
        outptr[3] = proposal_boxes[ picked[i] ].y2;
    }

    if (top_blobs.size() > 1)
    {
        Mat& roi_score_blob = top_blobs[1];
        roi_score_blob.create(1, 1, picked_count);
        if (roi_score_blob.empty())
            return -100;

        for (int i=0; i<picked_count; i++)
        {
            float* outptr = roi_score_blob.channel(i);
            outptr[0] = scores[ picked[i] ];
        }
    }

    return 0;
}